

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1160.cpp
# Opt level: O1

int main(void)

{
  int *piVar1;
  pointer __first;
  pointer __last;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int m;
  int n;
  vector<e,_std::allocator<e>_> v;
  int l;
  int b;
  int a;
  int local_70;
  int local_6c;
  vector<e,_std::allocator<e>_> local_68;
  e local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_6c);
  std::istream::operator>>(piVar5,&local_70);
  local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start =
       (e *)0x0;
  local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish =
       (e *)0x0;
  local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (e *)0x0;
  if (0 < local_70) {
    iVar8 = 0;
    do {
      piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_34);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_38);
      std::istream::operator>>(piVar5,&local_3c);
      local_48.a = local_34 + -1;
      local_48.b = local_38 + -1;
      local_48.l = local_3c;
      if (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<e,_std::allocator<e>_>::_M_realloc_insert<e>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
        _M_finish)->l = local_3c;
        (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
        _M_finish)->a = local_48.a;
        (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
        _M_finish)->b = local_48.b;
        local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish
             = local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_70);
  }
  __last = local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  __first = local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish)
  {
    uVar7 = ((long)local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<e*,std::vector<e,std::allocator<e>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(e,e)>>
              ((__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)
               local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)
                        local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                        super__Vector_impl_data._M_finish,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(e,_e)>)0x10124c);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<e*,std::vector<e,std::allocator<e>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(e,e)>>
              ((__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)__first,
               (__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)__last,
               (_Iter_comp_iter<bool_(*)(e,_e)>)0x10124c);
  }
  iVar8 = local_6c;
  if (0 < (long)local_6c) {
    memset(r + 1,0,(long)local_6c << 2);
    uVar7 = 1;
    do {
      t[uVar7] = (int)uVar7;
      uVar7 = uVar7 + 1;
    } while (iVar8 + 1 != uVar7);
  }
  if (0 < local_70) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      iVar8 = *(int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                               super__Vector_impl_data._M_start)->a + lVar10);
      iVar4 = *(int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                               super__Vector_impl_data._M_start)->b + lVar10);
      iVar2 = find(iVar8);
      iVar3 = find(iVar4);
      if (iVar2 != iVar3) {
        iVar2 = *(int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                 super__Vector_impl_data._M_start)->l + lVar10);
        if (max < iVar2) {
          max = iVar2;
        }
        piVar1 = (int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                 super__Vector_impl_data._M_start)->l + lVar10);
        *piVar1 = -*piVar1;
        iVar2 = find(iVar8);
        iVar4 = find(iVar4);
        iVar8 = r[iVar4];
        if (iVar8 < r[iVar2]) {
          t[iVar4] = iVar2;
        }
        else {
          t[iVar2] = iVar4;
          if (r[iVar2] == iVar8) {
            r[iVar4] = iVar8 + 1;
          }
        }
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar9 < local_70);
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_6c + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (0 < local_70) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      if (*(int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                           super__Vector_impl_data._M_start)->l + lVar10) < 0) {
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            *(int *)((long)&(local_68.super__Vector_base<e,_std::allocator<e>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->a + lVar10)
                            + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,*(int *)((long)&(local_68.
                                                  super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                                  super__Vector_impl_data._M_start)->b + lVar10) + 1
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar9 < local_70);
  }
  if (local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start !=
      (e *)0x0) {
    operator_delete(local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    int n, m;

    std::cin >> n >> m;
    std::vector<e> v;

    for (int i = 0; i < m; ++i) {
        int a, b, l;
        std::cin >> a >> b >> l;
        v.push_back({a - 1, b - 1, l});
    }

    std::sort(v.begin(), v.end(), cmp);

    for (int i = 1; i <= n; i++) {
        r[i] = 0;
        t[i] = i;
    }

    for (int i = 0; i < m; ++i) {
        int n1 = v[i].a;
        int n2 = v[i].b;

        if (find(n1) != find(n2)) {
            if (v[i].l > max) {
                max = v[i].l;
            }
            v[i].l *= -1;

            int x = find(n1);
            int y = find(n2);
            if (r[x] > r[y]) t[y] = x;
            else {
                t[x] = y;
                if (r[x] == r[y]) r[y]++;
            }
        }
    }

    std::cout << max << "\n" << n - 1 << "\n";

    for (int j = 0; j < m; ++j){
        if (v[j].l < 0){
            std::cout << v[j].a + 1 << " " << v[j].b + 1 << "\n";
        }
    }
    return 0;
}